

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

void __thiscall IZDeflate::copy_block(IZDeflate *this,char *block,uint len,int header)

{
  uint uVar1;
  byte bVar2;
  uint local_2c;
  uint local_1c;
  int header_local;
  uint len_local;
  char *block_local;
  IZDeflate *this_local;
  
  bi_windup(this);
  if (header != 0) {
    if (this->out_size - 1 <= this->out_offset) {
      flush_outbuf(this->out_buf,&this->out_offset);
    }
    uVar1 = this->out_offset;
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = (byte)len;
    bVar2 = (byte)(len >> 8);
    uVar1 = this->out_offset;
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = bVar2;
    if (this->out_size - 1 <= this->out_offset) {
      flush_outbuf(this->out_buf,&this->out_offset);
    }
    uVar1 = this->out_offset;
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = (byte)len ^ 0xff;
    uVar1 = this->out_offset;
    this->out_offset = uVar1 + 1;
    this->out_buf[uVar1] = bVar2 ^ 0xff;
  }
  if (this->flush_flg == 0) {
    if (this->out_size < this->out_offset + len) {
      error("output buffer too small for in-memory compression");
    }
    else {
      memcpy(this->out_buf + this->out_offset,block,(ulong)len);
      this->out_offset = len + this->out_offset;
    }
  }
  else {
    flush_outbuf(this->out_buf,&this->out_offset);
    local_1c = len;
    _header_local = block;
    if (this->key == (char *)0x0) {
      this->out_offset = len;
      flush_outbuf(block,&this->out_offset);
    }
    else {
      while (local_1c != 0) {
        if (local_1c < this->out_size) {
          local_2c = local_1c;
        }
        else {
          local_2c = this->out_size;
        }
        this->out_offset = local_2c;
        memcpy(this->out_buf,_header_local,(ulong)this->out_offset);
        _header_local = _header_local + this->out_offset;
        local_1c = local_1c - this->out_offset;
        flush_outbuf(this->out_buf,&this->out_offset);
      }
    }
  }
  return;
}

Assistant:

void IZDeflate::copy_block(char *block, unsigned len, int header)
    // char *block;  /* the input data */
    // unsigned len; /* its length */
    // int header;   /* true if block header must be written */
{
    bi_windup();              /* align on byte boundary */

    if (header) {
        PUTSHORT((ush)len);
        PUTSHORT((ush)~len);
#ifdef DEBUG
        bits_sent += 2*16;
#endif
    }
    if (flush_flg) {
        flush_outbuf(out_buf, &out_offset);
        if (key != (char *)NULL) {  /* key is the global password pointer */
            /* Encryption modifies the data in the output buffer. But the
             * copied input data must remain intact for further deflate
             * string matching lookups.  Therefore, the input data is
             * copied into the compression output buffer for flushing
             * to the compressed/encrypted output stream.
             */
            while(len > 0) {
                out_offset = (len < out_size ? len : out_size);
                memcpy(out_buf, block, out_offset);
                block += out_offset;
                len -= out_offset;
                flush_outbuf(out_buf, &out_offset);
            }
        } else {
            /* Without encryption, the output routines do not touch the
             * written data, so there is no need for an additional copy
             * operation.
             */
            out_offset = len;
            flush_outbuf(block, &out_offset);
        }
    } else if (out_offset + len > out_size) {
        error("output buffer too small for in-memory compression");
    } else {
        memcpy(out_buf + out_offset, block, len);
        out_offset += len;
    }
#ifdef DEBUG
    bits_sent += (ulg)len<<3;
#endif
}